

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O2

int adios2::utils::printAttributeValue<char>(Engine *fp,IO *io,Attribute<char> *attribute)

{
  DataType adiosvartype;
  long lVar1;
  long lVar2;
  size_t j;
  ulong uVar3;
  
  adiosvartype = *(DataType *)(attribute + 0x28);
  if (attribute[0x38] == (Attribute<char>)0x1) {
    print_data(attribute + 0x58,0,adiosvartype,true,false);
  }
  else {
    fputc(0x7b,outf);
    lVar1 = *(long *)(attribute + 0x48);
    lVar2 = *(long *)(attribute + 0x40);
    for (uVar3 = 0; lVar1 - lVar2 != uVar3; uVar3 = uVar3 + 1) {
      print_data((void *)(*(long *)(attribute + 0x40) + uVar3),0,adiosvartype,true,false);
      if (uVar3 < (lVar1 - lVar2) - 1U) {
        fwrite(", ",2,1,outf);
      }
    }
    fputc(0x7d,outf);
  }
  return 0;
}

Assistant:

int printAttributeValue(core::Engine *fp, core::IO *io, core::Attribute<T> *attribute)
{
    DataType adiosvartype = attribute->m_Type;
    if (attribute->m_IsSingleValue)
    {
        print_data((void *)&attribute->m_DataSingleValue, 0, adiosvartype, true);
    }
    else
    {
        fprintf(outf, "{");
        size_t nelems = attribute->m_DataArray.size();
        for (size_t j = 0; j < nelems; j++)
        {
            print_data((void *)&attribute->m_DataArray[j], 0, adiosvartype, true);
            if (j < nelems - 1)
            {
                fprintf(outf, ", ");
            }
        }
        fprintf(outf, "}");
    }
    return 0;
}